

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O2

int __thiscall
TPZFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontNonSym<std::complex<float>_>_>
::Subst_Forward(TPZFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontNonSym<std::complex<float>_>_>
                *this,TPZFMatrix<std::complex<float>_> *b)

{
  std::operator<<((ostream *)&std::cout,"Entering Forward Substitution\n");
  std::ostream::flush();
  TPZFileEqnStorage<std::complex<float>_>::Forward
            (&this->fStorage,b,(this->fFront).super_TPZFront<std::complex<float>_>.fDecomposeType);
  return 1;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::Subst_Forward(TPZFMatrix<TVar> *b) const {
	cout << "Entering Forward Substitution\n";
	cout.flush();
	DecomposeType dec = fFront.GetDecomposeType();
//	if(dec != ECholesky) cout << "TPZFrontMatrix::Subst_Forward non matching decomposition\n";
	fStorage.Forward(*b, dec);
	return 1;
}